

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

void callhook(lua_State *L,int event,BCLine line)

{
  uint64_t uVar1;
  int local_b0 [2];
  lua_Debug ar;
  lua_Hook hookf;
  global_State *g;
  BCLine line_local;
  int event_local;
  lua_State *L_local;
  
  uVar1 = (L->glref).ptr64;
  ar._112_8_ = *(long *)(uVar1 + 0x150);
  if ((ar._112_8_ != 0) && ((*(byte *)(uVar1 + 0x91) & 0x10) == 0)) {
    *(uint *)(uVar1 + 0x3cc) = *(uint *)(uVar1 + 0x3cc) & 0xffffffef;
    ar.short_src._52_4_ = SUB84((long)((long)L->base + (-8 - (L->stack).ptr64)) >> 3,0);
    local_b0[0] = event;
    ar.source._0_4_ = line;
    if ((long)((L->maxstack).ptr64 - (long)L->top) < 0xa9) {
      lj_state_growstack(L,0x15);
    }
    *(byte *)(uVar1 + 0x91) = *(byte *)(uVar1 + 0x91) | 0x10;
    (*(code *)ar._112_8_)(L,local_b0);
    *(lua_State **)(uVar1 + 0x170) = L;
    *(byte *)(uVar1 + 0x91) = *(byte *)(uVar1 + 0x91) & 0xef;
  }
  return;
}

Assistant:

static void callhook(lua_State *L, int event, BCLine line)
{
  global_State *g = G(L);
  lua_Hook hookf = g->hookf;
  if (hookf && !hook_active(g)) {
    lua_Debug ar;
    lj_trace_abort(g);  /* Abort recording on any hook call. */
    ar.event = event;
    ar.currentline = line;
    /* Top frame, nextframe = NULL. */
    ar.i_ci = (int)((L->base-1) - tvref(L->stack));
    lj_state_checkstack(L, 1+LUA_MINSTACK);
#if LJ_HASPROFILE && !LJ_PROFILE_SIGPROF
    lj_profile_hook_enter(g);
#else
    hook_enter(g);
#endif
    hookf(L, &ar);
    lj_assertG(hook_active(g), "active hook flag removed");
    setgcref(g->cur_L, obj2gco(L));
#if LJ_HASPROFILE && !LJ_PROFILE_SIGPROF
    lj_profile_hook_leave(g);
#else
    hook_leave(g);
#endif
  }
}